

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O3

void __thiscall
CVmObjPattern::CVmObjPattern(CVmObjPattern *this,re_compiled_pattern *pat,vm_val_t *src_str)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00325280;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,this);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  (this->super_CVmObject).ext_ = pcVar3;
  aVar1 = src_str->val;
  *(undefined8 *)(pcVar3 + 8) = *(undefined8 *)src_str;
  *(anon_union_8_8_cb74652f_for_val *)(pcVar3 + 0x10) = aVar1;
  *(re_compiled_pattern **)(this->super_CVmObject).ext_ = pat;
  return;
}

Assistant:

CVmObjPattern::CVmObjPattern(VMG_ re_compiled_pattern *pat,
                             const vm_val_t *src_str)
{
    /* allocate my extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* remember my source data */
    set_orig_str(src_str);

    /* remember the compiled pattern */
    set_pattern(pat);
}